

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoPrepare(Gia_IsoMan_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  word *pwVar7;
  void *__ptr;
  undefined4 *__ptr_00;
  Gia_Obj_t *pGVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  
  piVar3 = p->pLevels;
  *piVar3 = 0;
  pGVar4 = p->pGia;
  pVVar5 = pGVar4->vCis;
  if (0 < pVVar5->nSize) {
    piVar6 = pVVar5->pArray;
    lVar10 = 0;
    do {
      iVar9 = piVar6[lVar10];
      if (((long)iVar9 < 0) || (pGVar4->nObjs <= iVar9)) goto LAB_006fb7da;
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      piVar3[iVar9] = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
  }
  iVar9 = pGVar4->nObjs;
  if ((0 < iVar9) && (pGVar8 = pGVar4->pObjs, pGVar8 != (Gia_Obj_t *)0x0)) {
    lVar10 = 0;
    lVar12 = 0;
    do {
      uVar14 = *(ulong *)pGVar8;
      if ((~(uint)uVar14 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar14) {
        iVar9 = *(int *)((long)piVar3 +
                        ((long)((uVar14 & 0x1fffffff) * -0x100000000 + lVar10) >> 0x1e));
        iVar13 = *(int *)((long)piVar3 +
                         ((long)((uVar14 >> 0x20 & 0x1fffffff) * -0x100000000 + lVar10) >> 0x1e));
        if (iVar13 < iVar9) {
          iVar13 = iVar9;
        }
        piVar3[lVar12] = iVar13 + 1;
        iVar9 = pGVar4->nObjs;
      }
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 0x100000000;
      pGVar8 = pGVar8 + 1;
    } while (lVar12 < iVar9);
  }
  pVVar5 = pGVar4->vCos;
  if (pVVar5->nSize < 1) {
    iVar13 = 0;
  }
  else {
    piVar6 = pVVar5->pArray;
    lVar10 = 0;
    iVar13 = 0;
    do {
      iVar2 = piVar6[lVar10];
      lVar12 = (long)iVar2;
      if ((lVar12 < 0) || (iVar9 <= iVar2)) {
LAB_006fb7da:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      iVar11 = piVar3[(int)(iVar2 - (*(uint *)(pGVar4->pObjs + lVar12) & 0x1fffffff))] + 1;
      piVar3[lVar12] = iVar11;
      iVar9 = pGVar4->nObjs;
      if (iVar9 <= iVar2) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (iVar13 <= iVar11) {
        iVar13 = iVar11;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
  }
  uVar1 = iVar13 + 1;
  __ptr = calloc((long)(int)uVar1,4);
  iVar9 = p->nObjs;
  if (1 < (long)iVar9) {
    lVar10 = 1;
    do {
      piVar6 = (int *)((long)__ptr + (long)piVar3[lVar10] * 4);
      *piVar6 = *piVar6 + 1;
      lVar10 = lVar10 + 1;
    } while (iVar9 != lVar10);
  }
  pVVar5 = p->vClasses;
  pVVar5->nSize = 0;
  uVar14 = 0;
  Vec_IntPush(pVVar5,0);
  iVar9 = 1;
  Vec_IntPush(p->vClasses,1);
  __ptr_00 = (undefined4 *)calloc((ulong)(iVar13 + 2),4);
  *__ptr_00 = 1;
  do {
    iVar13 = *(int *)((long)__ptr + uVar14 * 4);
    if (iVar13 < 1) {
      __assert_fail("pLevSizes[i] > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0xeb,"void Gia_IsoPrepare(Gia_IsoMan_t *)");
    }
    Vec_IntPush(p->vClasses,iVar9);
    Vec_IntPush(p->vClasses,iVar13);
    iVar9 = iVar9 + iVar13;
    __ptr_00[uVar14 + 1] = iVar9;
    uVar14 = uVar14 + 1;
  } while (uVar1 != uVar14);
  if (__ptr_00[(int)uVar1] != p->nObjs) {
    __assert_fail("pLevBegins[MaxLev+1] == p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0xf0,"void Gia_IsoPrepare(Gia_IsoMan_t *)");
  }
  if ((int)__ptr_00[(int)uVar1] < 2) {
    free(__ptr_00);
  }
  else {
    piVar3 = p->pLevels;
    pwVar7 = p->pStoreW;
    lVar10 = 1;
    do {
      iVar9 = __ptr_00[piVar3[lVar10]];
      __ptr_00[piVar3[lVar10]] = iVar9 + 1;
      *(int *)((long)pwVar7 + (long)iVar9 * 8 + 4) = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nObjs);
    free(__ptr_00);
    if (__ptr == (void *)0x0) {
      return;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_IsoPrepare( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj;
    int * pLevBegins, * pLevSizes;
    int i, iObj, MaxLev = 0;
    // assign levels
    p->pLevels[0] = 0;
    Gia_ManForEachCi( p->pGia, pObj, i )
        p->pLevels[Gia_ObjId(p->pGia, pObj)] = 0;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        p->pLevels[i] = 1 + Abc_MaxInt( p->pLevels[Gia_ObjFaninId0(pObj, i)], p->pLevels[Gia_ObjFaninId1(pObj, i)] );
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        p->pLevels[iObj] = 1 + p->pLevels[Gia_ObjFaninId0(pObj, iObj)]; // "1 +" is different!
        MaxLev = Abc_MaxInt( MaxLev, p->pLevels[Gia_ObjId(p->pGia, pObj)] );
    }

    // count nodes on each level
    pLevSizes = ABC_CALLOC( int, MaxLev+1 );
    for ( i = 1; i < p->nObjs; i++ )
        pLevSizes[p->pLevels[i]]++;
    // start classes
    Vec_IntClear( p->vClasses );
    Vec_IntPush( p->vClasses, 0 );
    Vec_IntPush( p->vClasses, 1 );
    // find beginning of each level
    pLevBegins = ABC_CALLOC( int, MaxLev+2 );
    pLevBegins[0] = 1;
    for ( i = 0; i <= MaxLev; i++ )
    {
        assert( pLevSizes[i] > 0 ); // we do not allow AIG with a const node and no PIs
        Vec_IntPush( p->vClasses, pLevBegins[i] );
        Vec_IntPush( p->vClasses, pLevSizes[i] );
        pLevBegins[i+1] = pLevBegins[i] + pLevSizes[i];
    }
    assert( pLevBegins[MaxLev+1] == p->nObjs );
    // put them into the structure
    for ( i = 1; i < p->nObjs; i++ )
        Gia_IsoSetItem( p, pLevBegins[p->pLevels[i]]++, i );
    ABC_FREE( pLevBegins );
    ABC_FREE( pLevSizes );
/*
    // print the results
    for ( i = 0; i < p->nObjs; i++ )
        printf( "%3d : (%d,%d)\n", i, Gia_IsoGetItem(p, i), Gia_IsoGetValue(p, i) );
    printf( "\n" );
*/
}